

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

void wiz_create_item(_Bool art)

{
  menu_conflict *menu_00;
  char *pcVar1;
  artifact *art_local;
  wchar_t j;
  menu_conflict *menu;
  wchar_t n;
  wchar_t i;
  int tvals [36];
  _Bool art_local_1;
  
  menu_00 = menu_new(MN_SKIN_COLUMNS,&wiz_create_item_menu);
  choose_artifact = art;
  menu_00->selections = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
  pcVar1 = "What kind of object?";
  if (art) {
    pcVar1 = "What kind of artifact?";
  }
  menu_00->title = pcVar1;
  menu._4_4_ = L'\0';
  menu._0_4_ = 0;
  do {
    if (L'#' < menu._4_4_) {
      (&n)[(int)menu] = L'\xffffd8f1';
      screen_save();
      clear_from(L'\0');
      menu_setpriv(menu_00,0x24,kb_info);
      menu_set_filter(menu_00,&n,(int)menu + 1);
      menu_layout(menu_00,&wiz_create_item_area);
      menu_select(menu_00,0,false);
      screen_load();
      mem_free(menu_00);
      player->upkeep->redraw = player->upkeep->redraw | 0x810000;
      handle_stuff(player);
      return;
    }
    if (kb_info[menu._4_4_].name != (char *)0x0) {
      if (art) {
        art_local._4_4_ = 1;
        while (((int)art_local._4_4_ < (int)(uint)z_info->a_max &&
               (a_info[(int)art_local._4_4_].tval != menu._4_4_))) {
          art_local._4_4_ = art_local._4_4_ + 1;
        }
        if (art_local._4_4_ == z_info->a_max) goto LAB_00280973;
      }
      (&n)[(int)menu] = menu._4_4_;
      menu._0_4_ = (int)menu + 1;
    }
LAB_00280973:
    menu._4_4_ = menu._4_4_ + L'\x01';
  } while( true );
}

Assistant:

void wiz_create_item(bool art)
{
	int tvals[TV_MAX];
	int i, n;

	struct menu *menu = menu_new(MN_SKIN_COLUMNS, &wiz_create_item_menu);

	choose_artifact = art;

	menu->selections = all_letters;
	menu->title = art ? "What kind of artifact?" : "What kind of object?";

	/* Make a list of all tvals for the filter */
	for (i = 0, n = 0; i < TV_MAX; i++) {
		/* Only real object bases */
		if (!kb_info[i].name) continue;

		/*
		 * For artifact creation, only include tvals which have an
		 * artifact.
		 */
		if (art) {
			int j;
			for (j = 1; j < z_info->a_max; j++) {
				const struct artifact *art_local = &a_info[j];
				if (art_local->tval == i) break;
			}
			if (j == z_info->a_max) continue;
		}

		tvals[n++] = i;
	}

	tvals[n++] = WIZ_CREATE_ALL_MENU_ITEM;

	screen_save();
	clear_from(0);

	menu_setpriv(menu, TV_MAX, kb_info);
	menu_set_filter(menu, tvals, n);
	menu_layout(menu, &wiz_create_item_area);
	menu_select(menu, 0, false);

	screen_load();
	mem_free(menu);

	/* Redraw map */
	player->upkeep->redraw |= (PR_MAP | PR_ITEMLIST);
	handle_stuff(player);
}